

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSurfaceMesh.cpp
# Opt level: O2

bool __thiscall
chrono::fea::ChContactTriangleXYZ::IsSubBlockActive(ChContactTriangleXYZ *this,int nblock)

{
  byte bVar1;
  __shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> local_18;
  int iVar2;
  
  if (nblock == 2) {
    std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_18,
               &(this->mnode3).
                super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
    iVar2 = (*((local_18._M_ptr)->super_ChNodeFEAbase)._vptr_ChNodeFEAbase[3])();
    bVar1 = (byte)iVar2;
  }
  else if (nblock == 1) {
    std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_18,
               &(this->mnode2).
                super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
    iVar2 = (*((local_18._M_ptr)->super_ChNodeFEAbase)._vptr_ChNodeFEAbase[3])();
    bVar1 = (byte)iVar2;
  }
  else {
    if (nblock != 0) {
      return false;
    }
    std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_18,
               &(this->mnode1).
                super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
    iVar2 = (*((local_18._M_ptr)->super_ChNodeFEAbase)._vptr_ChNodeFEAbase[3])();
    bVar1 = (byte)iVar2;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18._M_refcount);
  return (bool)(bVar1 ^ 1);
}

Assistant:

bool ChContactTriangleXYZ::IsSubBlockActive(int nblock) const {
    if (nblock == 0)
        return !GetNode1()->GetFixed();
    if (nblock == 1)
        return !GetNode2()->GetFixed();
    if (nblock == 2)
        return !GetNode3()->GetFixed();

    return false;
}